

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  Vec_Int_t *p;
  int *piVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  
  __s = Extra_FileReadContents(pFileName);
  sVar6 = strlen(__s);
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  iVar9 = vNames->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar10 = iVar9;
  }
  p->nSize = 0;
  p->nCap = iVar10;
  if (iVar10 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar10 << 2);
  }
  p->pArray = piVar7;
  bVar3 = true;
  iVar10 = -1;
  pcVar11 = __s;
  do {
    cVar2 = *pcVar11;
    if (cVar2 == '\n') {
      iVar10 = ((int)pcVar11 - (int)__s) + 1;
    }
    else if (cVar2 == '(') {
      bVar4 = !bVar3;
      bVar3 = false;
      if (bVar4) {
        pcVar11 = strtok(pcVar11 + 1,"  \n\r\t");
        iVar9 = vNames->nSize;
        if (0 < iVar9) {
          lVar12 = 0;
          do {
            iVar5 = strcmp((char *)vNames->pArray[lVar12],pcVar11);
            if (iVar5 == 0) {
              Vec_IntPush(p,iVar10);
              Vec_IntPush(p,(int)lVar12);
              iVar9 = vNames->nSize;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar9);
        }
        sVar8 = strlen(pcVar11);
        pcVar11 = pcVar11 + (sVar8 - 1);
        do {
          pcVar1 = pcVar11 + 1;
          pcVar11 = pcVar11 + 1;
        } while (*pcVar1 == '\0');
        bVar3 = false;
        if (__s + sVar6 <= pcVar11) {
          __assert_fail("pTemp < pLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                        ,0x2b9,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
        }
      }
    }
    else if (cVar2 == '\0') {
      if (p->nSize == iVar9 * 2) {
        free(__s);
        return p;
      }
      __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x2bd,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
    }
    pcVar11 = pcVar11 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t" );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}